

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O1

bool __thiscall luna::Table::NextKeyValue(Table *this,Value *key,Value *next_key,Value *next_value)

{
  double __x;
  vector<luna::Value,_std::allocator<luna::Value>_> *pvVar1;
  _Hashtable<luna::Value,_std::pair<const_luna::Value,_luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>,_std::__detail::_Select1st,_std::equal_to<luna::Value>,_std::hash<luna::Value>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>
  *puVar2;
  ulong uVar3;
  iterator iVar4;
  _Hash_node_base *p_Var5;
  anon_union_8_9_8deb4486_for_Value_0 *paVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  undefined1 auVar10 [16];
  
  if (key->type_ == ValueT_Number) {
    __x = (key->field_0).num_;
    dVar9 = floor(__x);
    if ((dVar9 == __x) && (!NAN(dVar9) && !NAN(__x))) {
      uVar3 = (long)(__x - 9.223372036854776e+18) & (long)__x >> 0x3f | (long)__x;
      uVar7 = uVar3 + 1;
      if (uVar7 != 0) {
        pvVar1 = (this->array_)._M_t.
                 super___uniq_ptr_impl<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_false>
                 ._M_head_impl;
        if (pvVar1 == (vector<luna::Value,_std::allocator<luna::Value>_> *)0x0) {
          uVar8 = 0;
        }
        else {
          uVar8 = (long)*(pointer *)
                         ((long)&(pvVar1->
                                 super__Vector_base<luna::Value,_std::allocator<luna::Value>_>).
                                 _M_impl + 8) -
                  *(long *)&(pvVar1->super__Vector_base<luna::Value,_std::allocator<luna::Value>_>).
                            _M_impl >> 4;
        }
        if (uVar7 <= uVar8) {
          auVar10._8_4_ = (int)(uVar7 >> 0x20);
          auVar10._0_8_ = uVar7;
          auVar10._12_4_ = 0x45300000;
          (next_key->field_0).num_ =
               (auVar10._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0);
          next_key->type_ = ValueT_Number;
          paVar6 = (anon_union_8_9_8deb4486_for_Value_0 *)
                   (uVar3 * 0x10 +
                   *(long *)&(((this->array_)._M_t.
                               super___uniq_ptr_impl<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
                               .
                               super__Head_base<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_false>
                              ._M_head_impl)->
                             super__Vector_base<luna::Value,_std::allocator<luna::Value>_>)._M_impl)
          ;
          goto LAB_001591e5;
        }
      }
    }
  }
  this_00 = &((this->hash_)._M_t.
              super___uniq_ptr_impl<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_*,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
              .
              super__Head_base<0UL,_std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_*,_false>
             ._M_head_impl)->_M_h;
  if (this_00 ==
      (_Hashtable<luna::Value,_std::pair<const_luna::Value,_luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>,_std::__detail::_Select1st,_std::equal_to<luna::Value>,_std::hash<luna::Value>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
       *)0x0) {
    return false;
  }
  iVar4 = std::
          _Hashtable<luna::Value,_std::pair<const_luna::Value,_luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>,_std::__detail::_Select1st,_std::equal_to<luna::Value>,_std::hash<luna::Value>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(this_00,key);
  if (iVar4.super__Node_iterator_base<std::pair<const_luna::Value,_luna::Value>,_true>._M_cur ==
      (__node_type *)0x0) {
    puVar2 = (this->hash_)._M_t.
             super___uniq_ptr_impl<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_*,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
             .
             super__Head_base<0UL,_std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_*,_false>
             ._M_head_impl;
    if ((puVar2->_M_h)._M_element_count == 0) {
      return false;
    }
    p_Var5 = (puVar2->_M_h)._M_before_begin._M_nxt;
  }
  else {
    p_Var5 = *(_Hash_node_base **)
              iVar4.super__Node_iterator_base<std::pair<const_luna::Value,_luna::Value>,_true>.
              _M_cur;
    if (p_Var5 == (_Hash_node_base *)0x0) {
      return false;
    }
  }
  next_key->type_ = *(ValueT *)&p_Var5[2]._M_nxt;
  next_key->field_0 = *(anon_union_8_9_8deb4486_for_Value_0 *)(p_Var5 + 1);
  paVar6 = (anon_union_8_9_8deb4486_for_Value_0 *)(p_Var5 + 3);
LAB_001591e5:
  next_value->type_ = *(ValueT *)(paVar6 + 1);
  next_value->field_0 = *paVar6;
  return true;
}

Assistant:

bool Table::NextKeyValue(const Value &key, Value &next_key, Value &next_value)
    {
        // array part
        if (key.type_ == ValueT_Number && IsInt(key.num_))
        {
            std::size_t index = static_cast<std::size_t>(key.num_) + 1;
            if (index >= 1 && index <= ArraySize())
            {
                next_key.num_ = index;
                next_key.type_ = ValueT_Number;
                next_value = (*array_)[index - 1];
                return true;
            }
        }

        // hash part
        if (hash_)
        {
            auto it = hash_->find(key);
            if (it == hash_->end() && !hash_->empty())
            {
                it = hash_->begin();
                next_key = it->first;
                next_value = it->second;
                return true;
            }

            if (it != hash_->end() && ++it != hash_->end())
            {
                next_key = it->first;
                next_value = it->second;
                return true;
            }
        }

        return false;
    }